

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# benchmarking.cpp
# Opt level: O2

void perf_compute_integral_img_int
               (_func_void_uint8_t_ptr_integral_image_ptr *function,uint8_t *gray_image,
               benchmark_data *data,bool is_padded)

{
  ulong uVar1;
  ulong uVar2;
  undefined1 auVar3 [16];
  integral_image *__ptr;
  uint64_t uVar4;
  undefined7 in_register_00000009;
  long lVar5;
  long lVar6;
  bool bVar7;
  undefined1 auVar8 [16];
  double dVar9;
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 in_ZMM2 [64];
  long local_80;
  double local_78;
  double local_70;
  vector<double,_std::allocator<double>_> cycleslist;
  
  if ((int)CONCAT71(in_register_00000009,is_padded) == 0) {
    __ptr = create_integral_img(data->width,data->height);
  }
  else {
    __ptr = create_padded_integral_img(data->width,data->height);
  }
  dVar9 = 1.0;
  local_80 = 100;
  do {
    cpuid_basic_info(0);
    uVar1 = rdtsc();
    local_80 = (long)(dVar9 * (double)local_80);
    lVar6 = local_80;
    while (bVar7 = lVar6 != 0, lVar6 = lVar6 + -1, bVar7) {
      (*function)(gray_image,__ptr);
    }
    uVar2 = rdtsc();
    cpuid_basic_info(0);
    auVar8 = vcvtusi2sd_avx512f(in_ZMM2._0_16_,
                                (((ulong)(uint)-(int)(uVar1 >> 0x20) << 0x20) - (uVar1 & 0xffffffff)
                                ) + (uVar2 & 0xffffffff) + (uVar2 & 0xffffffff00000000));
    local_78 = auVar8._0_8_;
    dVar9 = 100000000.0 / local_78;
  } while (2.0 < dVar9);
  cycleslist.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  cycleslist.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  cycleslist.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  local_70 = 0.0;
  for (lVar6 = 0; lVar6 != 10; lVar6 = lVar6 + 1) {
    cpuid_basic_info(0);
    uVar1 = rdtsc();
    lVar5 = local_80;
    while (bVar7 = lVar5 != 0, lVar5 = lVar5 + -1, bVar7) {
      (*function)(gray_image,__ptr);
    }
    uVar2 = rdtsc();
    cpuid_basic_info(0);
    auVar8 = vcvtusi2sd_avx512f(in_ZMM2._0_16_,
                                (((ulong)(uint)-(int)(uVar1 >> 0x20) << 0x20) - (uVar1 & 0xffffffff)
                                ) + (uVar2 & 0xffffffff) + (uVar2 & 0xffffffff00000000));
    dVar9 = auVar8._0_8_ / (double)local_80;
    local_78 = dVar9;
    std::vector<double,_std::allocator<double>_>::push_back(&cycleslist,&local_78);
    local_70 = local_70 + dVar9;
  }
  dVar9 = local_70 / 10.0;
  free(__ptr->padded_data);
  free(__ptr);
  lVar6 = data->num_flops;
  local_78 = dVar9;
  std::
  __sort<__gnu_cxx::__normal_iterator<double*,std::vector<double,std::allocator<double>>>,__gnu_cxx::__ops::_Iter_less_iter>
            (cycleslist.super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start,
             cycleslist.super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_finish);
  auVar13._8_8_ = 0x3fdfffffffffffff;
  auVar13._0_8_ = 0x3fdfffffffffffff;
  auVar10._0_8_ = ((double)lVar6 * 100.0) / dVar9;
  auVar10._8_8_ = 0;
  auVar3._8_8_ = 0x8000000000000000;
  auVar3._0_8_ = 0x8000000000000000;
  auVar8 = vpternlogq_avx512vl(auVar13,auVar10,auVar3,0xf8);
  auVar11._8_8_ = 0;
  auVar11._0_8_ = auVar10._0_8_ + auVar8._0_8_;
  auVar3 = vroundsd_avx(auVar11,auVar11,0xb);
  auVar12._8_8_ = 0;
  auVar12._0_8_ = local_78;
  auVar8 = vmovhps_avx(auVar12,*cycleslist.super__Vector_base<double,_std::allocator<double>_>.
                                _M_impl.super__Vector_impl_data._M_start);
  auVar8 = vcvttpd2uqq_avx512vl(auVar8);
  data->avg_cycles = auVar8._0_8_;
  data->min_cycles = auVar8._8_8_;
  auVar8._8_8_ = 0;
  auVar8._0_8_ = cycleslist.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                 super__Vector_impl_data._M_finish[-1];
  uVar4 = vcvttsd2usi_avx512f(auVar8);
  data->max_cycles = uVar4;
  data->flops_per_cycle = auVar3._0_8_ / 100.0;
  std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
            (&cycleslist.super__Vector_base<double,_std::allocator<double>_>);
  return;
}

Assistant:

void perf_compute_integral_img_int(void (*function)(uint8_t *, struct integral_image *), uint8_t *gray_image,
                                   struct benchmark_data &data, bool is_padded) {
    double cycles = 0.;
    long num_runs = 100;
    double multiplier = 1;
    uint64_t start, end;

    // Checking if integral image should be padded and initializing it
    struct integral_image *iimage;
    if (!is_padded) {
        iimage = create_integral_img(data.width, data.height);
    } else {
        iimage = create_padded_integral_img(data.width, data.height);
    }

#ifdef WARM_UP
    // Warm-up phase: we determine a number of executions that allows
    // the code to be executed for at least CYCLES_REQUIRED cycles.
    // This helps excluding timing overhead when measuring small runtimes.
    do {
        num_runs = num_runs * multiplier;
        start = start_tsc();
        for (size_t i = 0; i < num_runs; i++) {
            (*function)(gray_image, iimage);
        }
        end = stop_tsc(start);

        cycles = (double)end;
        multiplier = (CYCLES_REQUIRED) / (cycles);

    } while (multiplier > 2);
#endif

    std::vector<double> cycleslist;

    // Actual performance measurements repeated REP times.
    // We simply store all results and compute medians during post-processing.
    double total_cycles = 0;
    for (size_t j = 0; j < REP; j++) {
        start = start_tsc();
        for (size_t i = 0; i < num_runs; ++i) {
            (*function)(gray_image, iimage);
        }
        end = stop_tsc(start);

        cycles = ((double)end) / num_runs;
        total_cycles += cycles;

        cycleslist.push_back(cycles);
    }
    total_cycles /= REP;

    free(iimage->padded_data);
    free(iimage);

    cycles = total_cycles;  // cyclesList.front();
    double flops_per_cycle = round((100.0 * data.num_flops) / cycles) / 100.0;
    std::sort(cycleslist.begin(), cycleslist.end());
    data.avg_cycles = (uint64_t)cycles;
    data.min_cycles = (uint64_t)cycleslist.front();
    data.max_cycles = (uint64_t)cycleslist.back();
    data.flops_per_cycle = flops_per_cycle;
}